

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve3right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y2,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *b,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rhs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rhs2)

{
  int iVar1;
  uint rn;
  int rn_00;
  int *ridx;
  int *piVar2;
  int *piVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pnVar4;
  int *piVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  pointer pnVar9;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3_00;
  int iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar11;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd28;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2_1;
  undefined4 uStack_2b0;
  int f;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  int *in_stack_fffffffffffffda8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  undefined8 uStack_1e0;
  int local_1d8;
  undefined1 local_1d4;
  fpclass_type local_1d0;
  int32_t local_1cc;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  undefined8 uStack_190;
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t local_17c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  fpclass_type local_e0;
  int32_t local_dc;
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar10 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar2 = (rhs->super_IdxSet).idx;
  iVar1 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  piVar3 = (rhs2->super_IdxSet).idx;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems._56_5_ = 0;
  epsilon.m_backend.data._M_elems[0xf]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar4 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar11 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar11 != pnVar4; pnVar11 = pnVar11 + 1
      ) {
    (pnVar11->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar11->m_backend).prec_elem = 0x10;
    (pnVar11->m_backend).data._M_elems[0] = 0;
    (pnVar11->m_backend).data._M_elems[1] = 0;
    (pnVar11->m_backend).data._M_elems[2] = 0;
    (pnVar11->m_backend).data._M_elems[3] = 0;
    (pnVar11->m_backend).data._M_elems[4] = 0;
    (pnVar11->m_backend).data._M_elems[5] = 0;
    (pnVar11->m_backend).data._M_elems[6] = 0;
    (pnVar11->m_backend).data._M_elems[7] = 0;
    (pnVar11->m_backend).data._M_elems[8] = 0;
    (pnVar11->m_backend).data._M_elems[9] = 0;
    (pnVar11->m_backend).data._M_elems[10] = 0;
    (pnVar11->m_backend).data._M_elems[0xb] = 0;
    (pnVar11->m_backend).data._M_elems[0xc] = 0;
    (pnVar11->m_backend).data._M_elems[0xd] = 0;
    (pnVar11->m_backend).data._M_elems[0xe] = 0;
    (pnVar11->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + 0x3d) = 0;
  }
  pnVar4 = (y2->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar11 = (y2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar11 != pnVar4; pnVar11 = pnVar11 + 1
      ) {
    (pnVar11->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar11->m_backend).prec_elem = 0x10;
    (pnVar11->m_backend).data._M_elems[0] = 0;
    (pnVar11->m_backend).data._M_elems[1] = 0;
    (pnVar11->m_backend).data._M_elems[2] = 0;
    (pnVar11->m_backend).data._M_elems[3] = 0;
    (pnVar11->m_backend).data._M_elems[4] = 0;
    (pnVar11->m_backend).data._M_elems[5] = 0;
    (pnVar11->m_backend).data._M_elems[6] = 0;
    (pnVar11->m_backend).data._M_elems[7] = 0;
    (pnVar11->m_backend).data._M_elems[8] = 0;
    (pnVar11->m_backend).data._M_elems[9] = 0;
    (pnVar11->m_backend).data._M_elems[10] = 0;
    (pnVar11->m_backend).data._M_elems[0xb] = 0;
    (pnVar11->m_backend).data._M_elems[0xc] = 0;
    (pnVar11->m_backend).data._M_elems[0xd] = 0;
    (pnVar11->m_backend).data._M_elems[0xe] = 0;
    (pnVar11->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + 0x3d) = 0;
  }
  this_02 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    rn_00 = (this->ssvec).super_IdxSet.num;
    local_88.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
    local_88.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
    local_88.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_88.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_88.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_88.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_88.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_88.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_88.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_88.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_88.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_88.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_88.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_88.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_88.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_88.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_88.m_backend.exp = epsilon.m_backend.exp;
    local_88.m_backend.neg = epsilon.m_backend.neg;
    local_88.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_88.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar5 = (x->super_IdxSet).idx;
    pnVar6 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_a0 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                         epsilon.m_backend.data._M_elems._56_5_);
    local_a8[0] = epsilon.m_backend.data._M_elems[0xc];
    local_a8[1] = epsilon.m_backend.data._M_elems[0xd];
    local_b8[0] = epsilon.m_backend.data._M_elems[8];
    local_b8[1] = epsilon.m_backend.data._M_elems[9];
    auStack_b0[0] = epsilon.m_backend.data._M_elems[10];
    auStack_b0[1] = epsilon.m_backend.data._M_elems[0xb];
    local_c8[0] = epsilon.m_backend.data._M_elems[4];
    local_c8[1] = epsilon.m_backend.data._M_elems[5];
    auStack_c0[0] = epsilon.m_backend.data._M_elems[6];
    auStack_c0[1] = epsilon.m_backend.data._M_elems[7];
    local_d8[0] = epsilon.m_backend.data._M_elems[0];
    local_d8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_d0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_d0[1] = epsilon.m_backend.data._M_elems[3];
    local_98 = epsilon.m_backend.exp;
    local_94 = epsilon.m_backend.neg;
    local_90 = epsilon.m_backend.fpclass;
    local_8c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar11 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_f0 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                         epsilon.m_backend.data._M_elems._56_5_);
    local_f8[0] = epsilon.m_backend.data._M_elems[0xc];
    local_f8[1] = epsilon.m_backend.data._M_elems[0xd];
    local_108[0] = epsilon.m_backend.data._M_elems[8];
    local_108[1] = epsilon.m_backend.data._M_elems[9];
    auStack_100[0] = epsilon.m_backend.data._M_elems[10];
    auStack_100[1] = epsilon.m_backend.data._M_elems[0xb];
    local_118[0] = epsilon.m_backend.data._M_elems[4];
    local_118[1] = epsilon.m_backend.data._M_elems[5];
    auStack_110[0] = epsilon.m_backend.data._M_elems[6];
    auStack_110[1] = epsilon.m_backend.data._M_elems[7];
    local_128[0] = epsilon.m_backend.data._M_elems[0];
    local_128[1] = epsilon.m_backend.data._M_elems[1];
    auStack_120[0] = epsilon.m_backend.data._M_elems[2];
    auStack_120[1] = epsilon.m_backend.data._M_elems[3];
    local_e8 = epsilon.m_backend.exp;
    local_e4 = epsilon.m_backend.neg;
    local_e0 = epsilon.m_backend.fpclass;
    local_dc = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    eps2_00.m_backend.data._M_elems._8_8_ = pnVar11;
    eps2_00.m_backend.data._M_elems._0_8_ = local_d8;
    eps2_00.m_backend.data._M_elems._16_8_ = piVar2;
    eps2_00.m_backend.data._M_elems[6] = iVar10;
    eps2_00.m_backend.data._M_elems[7] = in_stack_fffffffffffffce4;
    eps2_00.m_backend.data._M_elems._32_8_ = pnVar4;
    eps2_00.m_backend.data._M_elems._40_8_ = local_128;
    eps2_00.m_backend.data._M_elems._48_8_ =
         (rhs2->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    eps2_00.m_backend.data._M_elems._56_8_ = piVar3;
    eps2_00.m_backend.exp = iVar1;
    eps2_00.m_backend._68_4_ = in_stack_fffffffffffffd0c;
    eps2_00.m_backend.fpclass = cpp_dec_float_finite;
    eps2_00.m_backend.prec_elem = 0;
    eps3_00.m_backend.data._M_elems._8_8_ = piVar5;
    eps3_00.m_backend.data._M_elems._0_8_ = pnVar6;
    eps3_00.m_backend.data._M_elems._16_8_ = y2;
    eps3_00.m_backend.data._M_elems[6] = uStack_2b0;
    eps3_00.m_backend.data._M_elems[7] = f;
    eps3_00.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[0];
    eps3_00.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[1];
    eps3_00.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[2];
    eps3_00.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[3];
    eps3_00.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[4];
    eps3_00.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[5];
    eps3_00.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[6];
    eps3_00.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[7];
    eps3_00.m_backend._64_8_ = epsilon.m_backend.data._M_elems._32_8_;
    eps3_00.m_backend.fpclass = epsilon.m_backend.data._M_elems[10];
    eps3_00.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xb];
    iVar10 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_02,&local_88,pnVar6,piVar5,pnVar7,ridx,rn_00,pnVar8,eps2_00,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x0,(int *)0x0,in_stack_fffffffffffffd28,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44((int)((ulong)b >> 0x20),rn_00),eps3_00,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._48_8_,
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                                        epsilon.m_backend.data._M_elems._56_5_),
                        epsilon.m_backend.exp,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend._72_8_,in_stack_fffffffffffffda8,(int *)this_02);
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar10;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    rn = (this->ssvec).super_IdxSet.num;
    local_178.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
    local_178.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
    local_178.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_178.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_178.m_backend.exp = epsilon.m_backend.exp;
    local_178.m_backend.neg = epsilon.m_backend.neg;
    local_178.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_178.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar5 = (x->super_IdxSet).idx;
    pnVar6 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_190 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                          epsilon.m_backend.data._M_elems._56_5_);
    local_198[0] = epsilon.m_backend.data._M_elems[0xc];
    local_198[1] = epsilon.m_backend.data._M_elems[0xd];
    local_1a8[0] = epsilon.m_backend.data._M_elems[8];
    local_1a8[1] = epsilon.m_backend.data._M_elems[9];
    auStack_1a0[0] = epsilon.m_backend.data._M_elems[10];
    auStack_1a0[1] = epsilon.m_backend.data._M_elems[0xb];
    local_1b8[0] = epsilon.m_backend.data._M_elems[4];
    local_1b8[1] = epsilon.m_backend.data._M_elems[5];
    auStack_1b0[0] = epsilon.m_backend.data._M_elems[6];
    auStack_1b0[1] = epsilon.m_backend.data._M_elems[7];
    local_1c8[0] = epsilon.m_backend.data._M_elems[0];
    local_1c8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_1c0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_1c0[1] = epsilon.m_backend.data._M_elems[3];
    local_188 = epsilon.m_backend.exp;
    local_184 = epsilon.m_backend.neg;
    local_180 = epsilon.m_backend.fpclass;
    local_17c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar11 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_1e0 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                          epsilon.m_backend.data._M_elems._56_5_);
    local_1e8[0] = epsilon.m_backend.data._M_elems[0xc];
    local_1e8[1] = epsilon.m_backend.data._M_elems[0xd];
    local_1f8[0] = epsilon.m_backend.data._M_elems[8];
    local_1f8[1] = epsilon.m_backend.data._M_elems[9];
    auStack_1f0[0] = epsilon.m_backend.data._M_elems[10];
    auStack_1f0[1] = epsilon.m_backend.data._M_elems[0xb];
    local_208[0] = epsilon.m_backend.data._M_elems[4];
    local_208[1] = epsilon.m_backend.data._M_elems[5];
    auStack_200[0] = epsilon.m_backend.data._M_elems[6];
    auStack_200[1] = epsilon.m_backend.data._M_elems[7];
    local_218[0] = epsilon.m_backend.data._M_elems[0];
    local_218[1] = epsilon.m_backend.data._M_elems[1];
    auStack_210[0] = epsilon.m_backend.data._M_elems[2];
    auStack_210[1] = epsilon.m_backend.data._M_elems[3];
    local_1d8 = epsilon.m_backend.exp;
    local_1d4 = epsilon.m_backend.neg;
    local_1d0 = epsilon.m_backend.fpclass;
    local_1cc = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    pnVar9 = (rhs2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar11;
    eps2.m_backend.data._M_elems._0_8_ = local_1c8;
    eps2.m_backend.data._M_elems._16_8_ = piVar2;
    eps2.m_backend.data._M_elems[6] = iVar10;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ = pnVar4;
    eps2.m_backend.data._M_elems._40_8_ = local_218;
    eps2.m_backend.data._M_elems._48_8_ = pnVar9;
    eps2.m_backend.data._M_elems._56_8_ = piVar3;
    eps2.m_backend.exp = iVar1;
    eps2.m_backend._68_4_ = 0;
    eps2.m_backend._72_8_ =
         (this->forest).
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    eps3.m_backend.data._M_elems._8_8_ = pnVar8;
    eps3.m_backend.data._M_elems._0_8_ = pnVar11;
    eps3.m_backend.data._M_elems._16_8_ = y2;
    eps3.m_backend.data._M_elems[6] = uStack_2b0;
    eps3.m_backend.data._M_elems[7] = f;
    eps3.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[0];
    eps3.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[1];
    eps3.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[2];
    eps3.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[3];
    eps3.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[4];
    eps3.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[5];
    eps3.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[6];
    eps3.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[7];
    eps3.m_backend._64_8_ = epsilon.m_backend.data._M_elems._32_8_;
    eps3.m_backend.fpclass = epsilon.m_backend.data._M_elems[10];
    eps3.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xb];
    iVar10 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_02,&local_178,pnVar6,piVar5,pnVar7,ridx,rn,pnVar8,eps2,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&f,(this->forest).super_IdxSet.idx,in_stack_fffffffffffffd28,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)(ulong)rn,eps3,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._48_8_,
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                                        epsilon.m_backend.data._M_elems._56_5_),
                        epsilon.m_backend.exp,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend._72_8_,in_stack_fffffffffffffda8,(int *)this_02);
    (x->super_IdxSet).num = iVar10;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}